

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffpkym(fitsfile *fptr,char *keyname,double *value,int decim,char *comm,int *status)

{
  int *status_00;
  size_t sVar1;
  size_t sVar2;
  undefined4 in_ECX;
  char *in_R8;
  int *in_R9;
  char card [81];
  char tmpstring [71];
  char valstring [71];
  int *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed4;
  double in_stack_fffffffffffffed8;
  int *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  fitsfile *in_stack_ffffffffffffff38;
  char local_88 [64];
  int *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  if (*in_R9 < 1) {
    strcpy(local_88,"(");
    ffd2e(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffec8,
          in_stack_fffffffffffffec0);
    status_00 = (int *)strlen(local_88);
    sVar1 = strlen(&stack0xffffffffffffff28);
    if ((long)status_00 + sVar1 + 2 < 0x47) {
      strcat(local_88,&stack0xffffffffffffff28);
      strcat(local_88,", ");
      ffd2e(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffec8,status_00)
      ;
      sVar1 = strlen(local_88);
      sVar2 = strlen(&stack0xffffffffffffff28);
      if (sVar1 + sVar2 + 1 < 0x47) {
        strcat(local_88,&stack0xffffffffffffff28);
        strcat(local_88,")");
        ffmkky((char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_R8,(char *)in_R9,
               in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        ffprec(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        local_4 = *in_R9;
      }
      else {
        ffpmsg((char *)0x23ac74);
        *in_R9 = 0x192;
        local_4 = 0x192;
      }
    }
    else {
      ffpmsg((char *)0x23abcf);
      *in_R9 = 0x192;
      local_4 = 0x192;
    }
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffpkym( fitsfile *fptr,      /* I - FITS file pointer                   */
            const char  *keyname,/* I - name of keyword to write            */
            double *value,       /* I - keyword value (real, imaginary)     */
            int   decim,         /* I - number of decimal places to display */
            const char  *comm,   /* I - keyword comment                     */
            int   *status)       /* IO - error status                       */
/*
  Write (put) the keyword, value and comment into the FITS header.
  Writes an complex double keyword value. Format = (realvalue, imagvalue)
*/
{
    char valstring[FLEN_VALUE], tmpstring[FLEN_VALUE];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    strcpy(valstring, "(" );
    ffd2e(value[0], decim, tmpstring, status); /* convert to string */
    if (strlen(valstring)+strlen(tmpstring)+2 > FLEN_VALUE-1)
    {
       ffpmsg("Error converting complex to string (ffpkym)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ", ");
    ffd2e(value[1], decim, tmpstring, status); /* convert to string */
    if (strlen(valstring)+strlen(tmpstring)+1 > FLEN_VALUE-1)
    {
       ffpmsg("Error converting complex to string (ffpkym)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ")");

    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword*/
    ffprec(fptr, card, status);  /* write the keyword*/

    return(*status);
}